

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O1

size_t elf_addrela(GlobalVars *gv,LinkedSection *ls,Reloc *rel,bool be,RelocList *reloclist,
                  _func_uint8_t_Reloc_ptr *reloc_vlink2elf)

{
  RelocInsert *pRVar1;
  byte bVar2;
  uint32_t symidx;
  lword v;
  
  if ((rel->flags & 0x10) != 0) {
    return 0;
  }
  if (rel->xrefname == (char *)0x0) {
    if ((rel->relocsect).ptr == (Section *)0x0) {
      if (rel->flags < 0x40) {
        return 0;
      }
      ierror("elf_addrela(): Reloc type %d (%s) at %s+0x%lx (addend 0x%llx) is missing a relocsect.lnk"
             ,(ulong)rel->rtype,reloc_name[rel->rtype],ls->name,rel->offset,rel->addend);
    }
    symidx = secsyms + ((rel->relocsect).lnk)->index;
  }
  else {
    symidx = elf_extsymidx(&elfsymlist,rel->xrefname);
  }
  bVar2 = (*reloc_vlink2elf)(rel);
  if (bVar2 == 0) {
    pRVar1 = rel->insert;
    if (pRVar1 == (RelocInsert *)0x0) {
      ierror("elf_addrela(): Reloc without insert-field");
    }
    else {
      error(0x20,fff[gv->dest_format]->tname,reloc_name[rel->rtype],(ulong)pRVar1->bpos,
            (ulong)pRVar1->bsiz,pRVar1->mask,ls->name,rel->offset);
    }
  }
  elf_addrelocnode(reloclist,rel->offset + ls->base,rel->addend,symidx,(uint)bVar2,be);
  if (gv->reloctab_format == '\x02') {
    v = 0;
  }
  else {
    v = rel->addend;
  }
  writesection(gv,ls->data + rel->offset,rel,v);
  return reloclist->writesize;
}

Assistant:

size_t elf_addrela(struct GlobalVars *gv,struct LinkedSection *ls,
                   struct Reloc *rel,bool be,struct RelocList *reloclist,
                   uint8_t (*reloc_vlink2elf)(struct Reloc *))
{
  uint32_t symidx;
  uint8_t rtype;

  if (rel->flags & RELF_INTERNAL)
    return 0;  /* internal relocations will never be exported */

  if (rel->xrefname) {
    symidx = elf_extsymidx(&elfsymlist,rel->xrefname);
  }
  else {
    if (rel->relocsect.lnk == NULL) {
      if (!(rel->flags & RELF_DYNLINK))
        return 0;  /* ignore, because it was resolved by a shared object */
      else
        ierror("elf_addrela(): Reloc type %d (%s) at %s+0x%lx (addend 0x%llx)"
               " is missing a relocsect.lnk",(int)rel->rtype,
               reloc_name[rel->rtype],ls->name,rel->offset,rel->addend);
    }
    symidx = (uint32_t)(rel->relocsect.lnk->index + secsyms);
  }

  if (!(rtype = reloc_vlink2elf(rel))) {
    struct RelocInsert *ri;

    if (ri = rel->insert)
      error(32,fff[gv->dest_format]->tname,reloc_name[rel->rtype],
            (int)ri->bpos,(int)ri->bsiz,ri->mask,ls->name,rel->offset);
    else
      ierror("elf_addrela(): Reloc without insert-field");
  }

  elf_addrelocnode(reloclist,ls->base+rel->offset,rel->addend,symidx,rtype,be);
  writesection(gv,ls->data+rel->offset,rel,
               gv->reloctab_format==RTAB_ADDEND ? 0 : rel->addend);
  return reloclist->writesize;
}